

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

extent_hooks_t *
duckdb_je_arena_set_extent_hooks(tsd_t *tsd,arena_t *arena,extent_hooks_t *extent_hooks)

{
  background_thread_info_t *pbVar1;
  background_thread_info_t *pbVar2;
  extent_hooks_t *peVar3;
  ulong uVar4;
  
  pbVar2 = duckdb_je_background_thread_info;
  uVar4 = (ulong)arena->ind % duckdb_je_max_background_threads;
  pbVar1 = duckdb_je_background_thread_info + uVar4;
  malloc_mutex_lock((tsdn_t *)tsd,&pbVar1->mtx);
  duckdb_je_pa_shard_disable_hpa((tsdn_t *)tsd,&arena->pa_shard);
  peVar3 = duckdb_je_base_extent_hooks_set(arena->base,extent_hooks);
  (pbVar1->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar2[uVar4].mtx.field_0 + 0x48));
  return peVar3;
}

Assistant:

extent_hooks_t *
arena_set_extent_hooks(tsd_t *tsd, arena_t *arena,
    extent_hooks_t *extent_hooks) {
	background_thread_info_t *info;
	if (have_background_thread) {
		info = arena_background_thread_info_get(arena);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	}
	/* No using the HPA now that we have the custom hooks. */
	pa_shard_disable_hpa(tsd_tsdn(tsd), &arena->pa_shard);
	extent_hooks_t *ret = base_extent_hooks_set(arena->base, extent_hooks);
	if (have_background_thread) {
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	}

	return ret;
}